

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

uint64_t vfio_unmap_dma(int fd,uint64_t iova,uint32_t size)

{
  int iVar1;
  undefined4 in_register_0000003c;
  vfio_iommu_type1_dma_unmap dma_unmap;
  undefined8 local_20;
  uint64_t local_18;
  ulong local_10;
  
  local_20 = 0x300000018;
  local_10 = (ulong)size;
  local_18 = iova;
  iVar1 = get_vfio_container(CONCAT44(in_register_0000003c,fd));
  iVar1 = ioctl(iVar1,0x3b72,&local_20);
  return (long)iVar1;
}

Assistant:

uint64_t vfio_unmap_dma(int fd, uint64_t iova, uint32_t size) {
	struct vfio_iommu_type1_dma_unmap dma_unmap = {
		.argsz = sizeof(dma_unmap),
		.flags = VFIO_DMA_MAP_FLAG_READ | VFIO_DMA_MAP_FLAG_WRITE,
		.iova = iova,
		.size = size
	};
	int cfd = get_vfio_container();
	int ret = ioctl(cfd, VFIO_IOMMU_UNMAP_DMA, &dma_unmap);
	if (ret == -1) {
		// Failed to unmap DMA region
		return -1;
	}
	return ret;
}